

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O2

void __thiscall soplex::VectorBase<double>::reDim(VectorBase<double> *this,int newdim,bool setZero)

{
  const_iterator __position;
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  value_type_conflict1 local_8;
  
  if ((int)CONCAT71(in_register_00000011,setZero) != 0) {
    __position._M_current =
         (this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar2 = (int)((ulong)((long)__position._M_current -
                         (long)(this->val).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    iVar1 = newdim - iVar2;
    if (iVar1 != 0 && iVar2 <= newdim) {
      local_8 = 0.0;
      std::vector<double,_std::allocator<double>_>::insert
                (&this->val,__position,(long)iVar1,&local_8);
      return;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->val,(long)newdim);
  return;
}

Assistant:

void reDim(int newdim, const bool setZero = true)
   {
      if(setZero && newdim > dim())
      {
         // Inserts 0 to the rest of the vectors.
         //
         // TODO: Is this important after the change of raw pointers to
         // std::vector. This is just a waste of operations, I think.
         val.insert(val.end(), newdim - VectorBase<R>::dim(), 0);
      }
      else
      {
         val.resize(newdim);
      }

   }